

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_rotate_transform(ALLEGRO_TRANSFORM *trans,float theta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = cosf(theta);
  fVar6 = sinf(theta);
  fVar1 = trans->m[0][0];
  fVar2 = trans->m[0][1];
  fVar3 = trans->m[1][0];
  fVar4 = trans->m[1][1];
  *(ulong *)trans->m[0] = CONCAT44(fVar1 * fVar6 + fVar2 * fVar5,fVar1 * fVar5 + -fVar2 * fVar6);
  *(ulong *)trans->m[1] = CONCAT44(fVar3 * fVar6 + fVar4 * fVar5,fVar3 * fVar5 + -fVar4 * fVar6);
  fVar1 = trans->m[3][1];
  fVar2 = trans->m[3][0];
  *(ulong *)trans->m[3] = CONCAT44(fVar2 * fVar6 + fVar1 * fVar5,fVar2 * fVar5 + -fVar1 * fVar6);
  return;
}

Assistant:

void al_rotate_transform(ALLEGRO_TRANSFORM *trans, float theta)
{
   float c, s;
   float t;
   ASSERT(trans);

   c = cosf(theta);
   s = sinf(theta);

   t = trans->m[0][0];
   trans->m[0][0] = t * c - trans->m[0][1] * s;
   trans->m[0][1] = t * s + trans->m[0][1] * c;

   t = trans->m[1][0];
   trans->m[1][0] = t * c - trans->m[1][1] * s;
   trans->m[1][1] = t * s + trans->m[1][1] * c;

   t = trans->m[3][0];
   trans->m[3][0] = t * c - trans->m[3][1] * s;
   trans->m[3][1] = t * s + trans->m[3][1] * c;
}